

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::operator==(GLMClassifier *a,GLMClassifier *b)

{
  uint32 uVar1;
  bool bVar2;
  StringVector *a_00;
  StringVector *b_00;
  Int64Vector *a_01;
  Int64Vector *b_01;
  
  bVar2 = operator!=(&a->weights_,&b->weights_);
  if ((((bVar2) || (bVar2 = operator!=(&a->offset_,&b->offset_), bVar2)) ||
      (a->postevaluationtransform_ != b->postevaluationtransform_)) ||
     ((a->classencoding_ != b->classencoding_ ||
      (uVar1 = a->_oneof_case_[0], uVar1 != b->_oneof_case_[0])))) {
    return false;
  }
  if (uVar1 == 0) {
    return true;
  }
  if (uVar1 != 100) {
    a_01 = GLMClassifier::int64classlabels(a);
    b_01 = GLMClassifier::int64classlabels(b);
    bVar2 = vectorsEqual<CoreML::Specification::Int64Vector>(a_01,b_01);
    return bVar2;
  }
  a_00 = GLMClassifier::stringclasslabels(a);
  b_00 = GLMClassifier::stringclasslabels(b);
  bVar2 = vectorsEqual<CoreML::Specification::StringVector>(a_00,b_00);
  return bVar2;
}

Assistant:

bool operator==(const GLMClassifier& a,
                        const GLMClassifier& b) {
            if (a.weights() != b.weights()) {
                return false;
            }
            if (a.offset() != b.offset()) {
                return false;
            }
            if (a.postevaluationtransform() != b.postevaluationtransform()) {
                return false;
            }
            if (a.classencoding() != b.classencoding()) {
                return false;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case GLMClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case GLMClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case GLMClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
        }